

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ssize_t __thiscall smf::MidiFile::write(MidiFile *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  MidiEvent *pMVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  uchar *puVar5;
  undefined4 in_register_00000034;
  ostream *out;
  MidiFile *pMVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  uchar endoftrack [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> trackdata;
  char local_5d;
  uchar local_5c [4];
  uchar *local_58;
  iterator iStack_50;
  uchar *local_48;
  int local_34;
  
  out = (ostream *)CONCAT44(in_register_00000034,__fd);
  local_34 = this->m_theTimeState;
  if (local_34 == 1) {
    makeDeltaTicks(this);
  }
  local_58._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x4d;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_58,1);
  local_58._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x54;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_58,1);
  local_58._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x68;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_58,1);
  local_58 = (uchar *)CONCAT71(local_58._1_7_,100);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_58,1);
  writeBigEndianULong(out,6);
  writeBigEndianUShort
            (out,(ushort)(((long)(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 8));
  writeBigEndianUShort
            (out,(ushort)((uint)(*(int *)&(this->m_events).
                                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&(this->m_events).
                                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  writeBigEndianUShort(out,(ushort)this->m_ticksPerQuarterNote);
  local_58 = (uchar *)0x0;
  iStack_50._M_current = (uchar *)0x0;
  local_48 = (uchar *)0x0;
  local_5c[0] = '\0';
  local_5c[1] = 0xff;
  local_5c[2] = '/';
  local_5c[3] = '\0';
  uVar3 = (ulong)((long)(this->m_events).
                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_events).
                       super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)uVar3) {
    lVar9 = 0;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,0x1e240);
      if (iStack_50._M_current != local_58) {
        iStack_50._M_current = local_58;
      }
      iVar8 = 0;
      while( true ) {
        iVar2 = MidiEventList::size((this->m_events).
                                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar9]);
        if (iVar2 <= iVar8) break;
        pMVar4 = MidiEventList::operator[]
                           ((this->m_events).
                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
        if ((pMVar4->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pMVar4->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pMVar4 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
          bVar1 = MidiMessage::isEndOfTrack(&pMVar4->super_MidiMessage);
          if (!bVar1) {
            pMVar6 = (MidiFile *)
                     (this->m_events).
                     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9];
            pMVar4 = MidiEventList::operator[]((MidiEventList *)pMVar6,iVar8);
            writeVLValue(pMVar6,(long)pMVar4->tick,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
            pMVar4 = MidiEventList::operator[]
                               ((this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
            iVar2 = MidiMessage::getCommandByte(&pMVar4->super_MidiMessage);
            if (iVar2 != 0xf0) {
              pMVar4 = MidiEventList::operator[]
                                 ((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
              iVar2 = MidiMessage::getCommandByte(&pMVar4->super_MidiMessage);
              if (iVar2 != 0xf7) {
                lVar7 = 0;
                while( true ) {
                  pMVar4 = MidiEventList::operator[]
                                     ((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
                  if (*(int *)&(pMVar4->super_MidiMessage).
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                      *(int *)&(pMVar4->super_MidiMessage).
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start <= lVar7) break;
                  pMVar4 = MidiEventList::operator[]
                                     ((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
                  puVar5 = (pMVar4->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar7;
                  if (iStack_50._M_current == local_48) {
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    _M_realloc_insert<unsigned_char_const&>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                               iStack_50,puVar5);
                  }
                  else {
                    *iStack_50._M_current = *puVar5;
                    iStack_50._M_current = iStack_50._M_current + 1;
                  }
                  lVar7 = lVar7 + 1;
                }
                goto LAB_0011786d;
              }
            }
            pMVar4 = MidiEventList::operator[]
                               ((this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
            puVar5 = (pMVar4->super_MidiMessage).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (iStack_50._M_current == local_48) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,iStack_50,
                         puVar5);
            }
            else {
              *iStack_50._M_current = *puVar5;
              iStack_50._M_current = iStack_50._M_current + 1;
            }
            pMVar6 = (MidiFile *)
                     (this->m_events).
                     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9];
            pMVar4 = MidiEventList::operator[]((MidiEventList *)pMVar6,iVar8);
            writeVLValue(pMVar6,(long)(int)(~*(uint *)&(pMVar4->super_MidiMessage).
                                                                                                              
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           *(int *)&(pMVar4->super_MidiMessage).
                                                                                                        
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
            lVar7 = 1;
            while( true ) {
              pMVar4 = MidiEventList::operator[]
                                 ((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
              if (*(int *)&(pMVar4->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                  *(int *)&(pMVar4->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start <= lVar7) break;
              pMVar4 = MidiEventList::operator[]
                                 ((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9],iVar8);
              puVar5 = (pMVar4->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7;
              if (iStack_50._M_current == local_48) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                           iStack_50,puVar5);
              }
              else {
                *iStack_50._M_current = *puVar5;
                iStack_50._M_current = iStack_50._M_current + 1;
              }
              lVar7 = lVar7 + 1;
            }
          }
        }
LAB_0011786d:
        iVar8 = iVar8 + 1;
      }
      iVar8 = (int)iStack_50._M_current - (int)local_58;
      if (((iVar8 < 3) || (local_58[iVar8 - 3] != 0xff)) || (local_58[iVar8 - 2] != '/')) {
        if (iStack_50._M_current == local_48) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,iStack_50,
                     local_5c);
        }
        else {
          *iStack_50._M_current = local_5c[0];
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        if (iStack_50._M_current == local_48) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,iStack_50,
                     local_5c + 1);
        }
        else {
          *iStack_50._M_current = local_5c[1];
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        if (iStack_50._M_current == local_48) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,iStack_50,
                     local_5c + 2);
        }
        else {
          *iStack_50._M_current = local_5c[2];
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        if (iStack_50._M_current == local_48) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,iStack_50,
                     local_5c + 3);
        }
        else {
          *iStack_50._M_current = local_5c[3];
          iStack_50._M_current = iStack_50._M_current + 1;
        }
      }
      local_5d = 'M';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_5d,1);
      local_5d = 'T';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_5d,1);
      local_5d = 'r';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_5d,1);
      local_5d = 'k';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_5d,1);
      writeBigEndianULong(out,(long)((int)iStack_50._M_current - (int)local_58));
      std::ostream::write((char *)out,(long)local_58);
      lVar9 = lVar9 + 1;
      uVar3 = (ulong)(int)((ulong)((long)(this->m_events).
                                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_events).
                                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (lVar9 < (long)uVar3);
  }
  if (local_34 == 1) {
    makeAbsoluteTicks(this);
    uVar3 = extraout_RAX;
  }
  if (local_58 != (uchar *)0x0) {
    operator_delete(local_58);
    uVar3 = extraout_RAX_00;
  }
  return CONCAT71((int7)(uVar3 >> 8),1);
}

Assistant:

bool MidiFile::write(std::ostream& out) {
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_ABSOLUTE) {
		makeDeltaTicks();
	}

	// write the header of the Standard MIDI File
	char ch;
	// 1. The characters "MThd"
	ch = 'M'; out << ch;
	ch = 'T'; out << ch;
	ch = 'h'; out << ch;
	ch = 'd'; out << ch;

	// 2. write the size of the header (always a "6" stored in unsigned long
	//    (4 bytes).
	ulong longdata = 6;
	writeBigEndianULong(out, longdata);

	// 3. MIDI file format, type 0, 1, or 2
	ushort shortdata;
	shortdata = static_cast<ushort>(getNumTracks() == 1 ? 0 : 1);
	writeBigEndianUShort(out,shortdata);

	// 4. write out the number of tracks.
	shortdata = static_cast<ushort>(getNumTracks());
	writeBigEndianUShort(out, shortdata);

	// 5. write out the number of ticks per quarternote. (avoiding SMPTE for now)
	shortdata = static_cast<ushort>(getTicksPerQuarterNote());
	writeBigEndianUShort(out, shortdata);

	// now write each track.
	std::vector<uchar> trackdata;
	uchar endoftrack[4] = {0, 0xff, 0x2f, 0x00};
	int i, j, k;
	int size;
	for (i=0; i<getNumTracks(); i++) {
		trackdata.reserve(123456);   // make the track data larger than
		                             // expected data input
		trackdata.clear();
		for (j=0; j<(int)m_events[i]->size(); j++) {
			if ((*m_events[i])[j].empty()) {
				// Don't write empty m_events (probably a delete message).
				continue;
			}
			if ((*m_events[i])[j].isEndOfTrack()) {
				// Suppress end-of-track meta messages (one will be added
				// automatically after all track data has been written).
				continue;
			}
			writeVLValue((*m_events[i])[j].tick, trackdata);
			if (((*m_events[i])[j].getCommandByte() == 0xf0) ||
					((*m_events[i])[j].getCommandByte() == 0xf7)) {
				// 0xf0 == Complete sysex message (0xf0 is part of the raw MIDI).
				// 0xf7 == Raw byte message (0xf7 not part of the raw MIDI).
				// Print the first byte of the message (0xf0 or 0xf7), then
				// print a VLV length for the rest of the bytes in the message.
				// In other words, when creating a 0xf0 or 0xf7 MIDI message,
				// do not insert the VLV byte length yourself, as this code will
				// do it for you automatically.
				trackdata.push_back((*m_events[i])[j][0]); // 0xf0 or 0xf7;
				writeVLValue(((int)(*m_events[i])[j].size())-1, trackdata);
				for (k=1; k<(int)(*m_events[i])[j].size(); k++) {
					trackdata.push_back((*m_events[i])[j][k]);
				}
			} else {
				// non-sysex type of message, so just output the
				// bytes of the message:
				for (k=0; k<(int)(*m_events[i])[j].size(); k++) {
					trackdata.push_back((*m_events[i])[j][k]);
				}
			}
		}
		size = (int)trackdata.size();
		if ((size < 3) || !((trackdata[size-3] == 0xff)
				&& (trackdata[size-2] == 0x2f))) {
			trackdata.push_back(endoftrack[0]);
			trackdata.push_back(endoftrack[1]);
			trackdata.push_back(endoftrack[2]);
			trackdata.push_back(endoftrack[3]);
		}

		// now ready to write to MIDI file.

		// first write the track ID marker "MTrk":
		ch = 'M'; out << ch;
		ch = 'T'; out << ch;
		ch = 'r'; out << ch;
		ch = 'k'; out << ch;

		// A. write the size of the MIDI data to follow:
		longdata = (int)trackdata.size();
		writeBigEndianULong(out, longdata);

		// B. write the actual data
		out.write((char*)trackdata.data(), trackdata.size());
	}

	if (oldTimeState == TIME_STATE_ABSOLUTE) {
		makeAbsoluteTicks();
	}

	return true;
}